

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::render(SessionImpl *this,uint32_t numFrames)

{
  Performer *pPVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  InputActions actions;
  uint local_54;
  InputEndpointActions local_50;
  Performer *local_48;
  _Any_data *local_40;
  _Any_data *local_38;
  
  uVar3 = (ulong)numFrames;
  if ((this->beginNextBlockCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_50._vptr_InputEndpointActions._0_4_ = numFrames;
    (*(this->beginNextBlockCallback)._M_invoker)
              ((_Any_data *)&this->beginNextBlockCallback,(uint *)&local_50);
  }
  if (numFrames != 0) {
    local_38 = (_Any_data *)&this->getBlockSizeCallback;
    local_40 = (_Any_data *)&this->preRenderCallback;
    do {
      uVar4 = (ulong)this->maxBlockSize;
      if ((uint)uVar3 < this->maxBlockSize) {
        uVar4 = uVar3;
      }
      if ((this->getBlockSizeCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_50._vptr_InputEndpointActions._0_4_ = (uint)uVar4;
        uVar2 = (*(this->getBlockSizeCallback)._M_invoker)(local_38,(uint *)&local_50);
        if (uVar2 < (uint)uVar4) {
          uVar4 = (ulong)uVar2;
        }
        if ((int)uVar4 == 0) {
          throwInternalCompilerError("render",0x19d);
        }
      }
      pPVar1 = (this->performer)._M_t.
               super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
               super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
               super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
      uVar2 = (uint)uVar4;
      (**(code **)(*(long *)pPVar1 + 0x68))(pPVar1,uVar4);
      if ((this->preRenderCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_48 = (this->performer)._M_t.
                   super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
                   super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
        local_50._vptr_InputEndpointActions = (_func_int **)&PTR__InputEndpointActions_002fb998;
        local_54 = uVar2;
        (*(this->preRenderCallback)._M_invoker)(local_40,&local_50,&local_54);
      }
      (**(code **)(*(long *)(this->performer)._M_t.
                            super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>
                            .super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl + 0xa8))()
      ;
      if ((this->postRenderCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_48 = (this->performer)._M_t.
                   super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
                   super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
        local_50._vptr_InputEndpointActions = (_func_int **)&PTR__OutputEndpointActions_002fba00;
        local_54 = uVar2;
        (*(this->postRenderCallback)._M_invoker)
                  ((_Any_data *)&this->postRenderCallback,(OutputEndpointActions *)&local_50,
                   &local_54);
      }
      LOCK();
      (this->totalFramesRendered).super___atomic_base<unsigned_long>._M_i =
           (this->totalFramesRendered).super___atomic_base<unsigned_long>._M_i + uVar4;
      UNLOCK();
      uVar2 = (uint)uVar3 - uVar2;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void render (uint32_t numFrames)
        {
            if (beginNextBlockCallback != nullptr)
                beginNextBlockCallback (numFrames);

            while (numFrames != 0)
            {
                auto framesToDo = std::min (maxBlockSize, numFrames);

                if (getBlockSizeCallback != nullptr)
                {
                    framesToDo = std::min (framesToDo, getBlockSizeCallback (framesToDo));

                    if (framesToDo == 0)
                    {
                        SOUL_ASSERT_FALSE; // should handle this error case?
                        break;
                    }
                }

                performer->prepare (framesToDo);

                if (preRenderCallback != nullptr)
                {
                    InputActions actions (*performer);
                    preRenderCallback (actions, framesToDo);
                }

                performer->advance();

                if (postRenderCallback != nullptr)
                {
                    OutputActions actions (*performer);
                    postRenderCallback (actions, framesToDo);
                }

                totalFramesRendered += framesToDo;
                numFrames -= framesToDo;
            }
        }